

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p,
          set_block_pixels_context *context)

{
  char cVar1;
  uint uVar2;
  dxt_format dVar3;
  element_type eVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  color_quad_u8 *pcVar7;
  bool bVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  etc1_quality eVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  etc1_block *dst_block;
  ulong uVar16;
  dxt1_block *pDXT1_block;
  color_quad_u8 pixels [16];
  uint8 selectors [16];
  results results;
  undefined1 local_b8 [4];
  int local_b4;
  color_quad_u8 *local_b0;
  uint local_a8;
  uint local_a4;
  crn_dxt_quality local_a0;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  bool local_98;
  bool local_97;
  bool local_96;
  color_quad_u8 *local_70;
  byte local_68 [16];
  dxt5_endpoint_optimizer *local_58;
  results local_50;
  
  uVar2 = this->m_num_elements_per_block;
  dVar3 = this->m_format;
  dst_block = (etc1_block *)(this->m_pElements + (this->m_blocks_x * block_y + block_x) * uVar2);
  switch(dVar3) {
  case cETC1:
    local_b8 = (undefined1  [4])cLowQuality;
    if (cCRNDXTQualityFast < p->m_quality) {
      local_b8 = (undefined1  [4])((p->m_quality != cCRNDXTQualityNormal) + cMediumQuality);
    }
    local_b4 = CONCAT31(local_b4._1_3_,p->m_dithering);
    goto LAB_0018a60c;
  case cETC2:
    local_b4 = CONCAT31(local_b4._1_3_,p->m_dithering);
    local_b8 = (undefined1  [4])cLowQuality;
    if (cCRNDXTQualityFast < p->m_quality) {
      local_b8 = (undefined1  [4])((p->m_quality != cCRNDXTQualityNormal) + cMediumQuality);
    }
LAB_0018a60c:
    rg_etc1::pack_etc1_block(dst_block,(uint *)pPixels,(etc1_pack_params *)local_b8);
    break;
  case cETC2A:
    eVar12 = cLowQuality;
    if (cCRNDXTQualityFast < p->m_quality) {
      eVar12 = (p->m_quality != cCRNDXTQualityNormal) + cMediumQuality;
    }
    if (uVar2 != 0) {
      uVar16 = 0;
      do {
        local_b8 = (undefined1  [4])eVar12;
        if (this->m_element_type[uVar16] == cAlphaETC2) {
          local_b4 = (int)this->m_element_component_index[uVar16];
          rg_etc1::pack_etc2_alpha(dst_block,(uint *)pPixels,(etc2a_pack_params *)local_b8);
        }
        else {
          local_b4 = CONCAT31(local_b4._1_3_,p->m_dithering);
          rg_etc1::pack_etc1_block(dst_block,(uint *)pPixels,(etc1_pack_params *)local_b8);
        }
        uVar16 = uVar16 + 1;
        dst_block = (etc1_block *)dst_block->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
    break;
  case cETC1S:
    uVar6._0_1_ = p->m_perceptual;
    uVar6._1_1_ = p->m_dithering;
    local_b4 = CONCAT22(local_b4._2_2_,uVar6);
    local_b8 = (undefined1  [4])cLowQuality;
    if (cCRNDXTQualityFast < p->m_quality) {
      local_b8 = (undefined1  [4])((p->m_quality != cCRNDXTQualityNormal) + cMediumQuality);
    }
    pack_etc1s_block(dst_block,pPixels,(crn_etc1_pack_params *)local_b8);
    break;
  case cETC2AS:
    if (uVar2 != 0) {
      uVar16 = 0;
      do {
        if (this->m_element_type[uVar16] == cAlphaETC2) {
          local_b8 = (undefined1  [4])((p->m_quality != cCRNDXTQualityNormal) + cMediumQuality);
          if (p->m_quality < cCRNDXTQualityNormal) {
            local_b8 = (undefined1  [4])cLowQuality;
          }
          local_b4 = (int)this->m_element_component_index[uVar16];
          rg_etc1::pack_etc2_alpha(dst_block,(uint *)pPixels,(etc2a_pack_params *)local_b8);
        }
        else {
          uVar5._0_1_ = p->m_perceptual;
          uVar5._1_1_ = p->m_dithering;
          local_b4 = CONCAT22(local_b4._2_2_,uVar5);
          local_b8 = (undefined1  [4])((p->m_quality != cCRNDXTQualityNormal) + cMediumQuality);
          if (p->m_quality < cCRNDXTQualityNormal) {
            local_b8 = (undefined1  [4])cLowQuality;
          }
          pack_etc1s_block(dst_block,pPixels,(crn_etc1_pack_params *)local_b8);
        }
        uVar16 = uVar16 + 1;
        dst_block = (etc1_block *)dst_block->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
    break;
  default:
    if (p->m_compressor == cCRNDXTCompressorRYG) {
      if (((uint)dVar3 < 5) && ((0x19U >> (dVar3 & 0x1f) & 1) != 0)) {
        lVar14 = 0;
        do {
          while( true ) {
            local_b8[lVar14 * 4] = pPixels[lVar14].field_0.field_0.b;
            local_b8[lVar14 * 4 + 1] = pPixels[lVar14].field_0.field_0.g;
            local_b8[lVar14 * 4 + 2] = pPixels[lVar14].field_0.field_0.r;
            if (dVar3 != cDXT1) break;
            local_b8[lVar14 * 4 + 3] = 0xff;
            lVar14 = lVar14 + 1;
            if (lVar14 == 0x10) {
LAB_0018aa18:
              ryg_dxt::sCompressDXTBlock((sU8 *)dst_block,(sU32 *)local_b8,dVar3 == cDXT5,0);
              return;
            }
          }
          local_b8[lVar14 * 4 + 3] = pPixels[lVar14].field_0.field_0.a;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x10);
        if (dVar3 == cDXT5A) {
          ryg_dxt::sCompressDXT5ABlock((sU8 *)dst_block,(sU32 *)local_b8);
          return;
        }
        goto LAB_0018aa18;
      }
    }
    else if (dVar3 != cDXT1A && p->m_compressor == cCRNDXTCompressorCRNF) {
      if (uVar2 == 0) {
        return;
      }
      uVar16 = 0;
      do {
        eVar4 = this->m_element_type[uVar16];
        if (eVar4 == cAlphaDXT5) {
          dxt_fast::compress_alpha_block
                    ((dxt5_block *)dst_block,pPixels,(int)this->m_element_component_index[uVar16]);
        }
        else if (eVar4 == cAlphaDXT3) {
          cVar1 = this->m_element_component_index[uVar16];
          uVar11 = 0;
          do {
            dxt3_block::set_alpha
                      ((dxt3_block *)dst_block,(uint)uVar11 & 3,(uint)(uVar11 >> 2) & 0x3fffffff,
                       (uint)pPixels[uVar11].field_0.c[(uint)(int)cVar1],true);
            uVar11 = uVar11 + 1;
          } while (uVar11 != 0x10);
        }
        else if (eVar4 == cColorDXT1) {
          dxt_fast::compress_color_block
                    ((dxt1_block *)dst_block,pPixels,cCRNDXTQualityFast < p->m_quality);
        }
        uVar16 = uVar16 + 1;
        dst_block = (etc1_block *)dst_block->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
      return;
    }
    if (uVar2 != 0) {
      local_58 = &context->m_dxt5_optimizer;
      uVar16 = 0;
      local_70 = pPixels;
      do {
        pcVar7 = local_70;
        eVar4 = this->m_element_type[uVar16];
        if (eVar4 == cAlphaDXT5) {
          local_50.m_error = (uint64)local_68;
          local_b8 = (undefined1  [4])(this->m_blocks_x * block_y + block_x);
          local_b0 = local_70;
          local_a8 = 0x10;
          local_a4 = (uint)this->m_element_component_index[uVar16];
          local_a0 = p->m_quality;
          local_9c = p->m_use_both_block_types;
          bVar8 = dxt5_endpoint_optimizer::compute(local_58,(params *)local_b8,(results *)&local_50)
          ;
          if (bVar8) {
            (dst_block->field_0).m_bytes[0] = (uint8)local_50.m_pSelectors;
            (dst_block->field_0).m_bytes[1] = local_50.m_pSelectors._1_1_;
            uVar9 = 0;
            uVar11 = 0;
            do {
              uVar15 = (ulong)(uVar9 >> 3);
              bVar10 = (byte)uVar9 & 7;
              if (uVar11 < 0xe) {
                uVar13 = (uint)local_68[uVar11] << bVar10 |
                         ~(7 << bVar10) &
                         (uint)CONCAT11(dst_block->m_low_color[uVar15 - 5],
                                        dst_block->m_low_color[uVar15 - 6]);
                dst_block->m_low_color[uVar15 - 5] = (uint8)(uVar13 >> 8);
              }
              else {
                uVar13 = (uint)local_68[uVar11] << bVar10 |
                         (uint)dst_block->m_low_color[uVar15 - 6] & ~(7 << bVar10);
              }
              dst_block->m_low_color[uVar15 - 6] = (uint8)uVar13;
              uVar11 = uVar11 + 1;
              uVar9 = uVar9 + 3;
            } while (uVar11 != 0x10);
          }
        }
        else if (eVar4 == cAlphaDXT3) {
          cVar1 = this->m_element_component_index[uVar16];
          uVar11 = 0;
          do {
            dxt3_block::set_alpha
                      ((dxt3_block *)dst_block,(uint)uVar11 & 3,(uint)(uVar11 >> 2) & 0x3fffffff,
                       (uint)pcVar7[uVar11].field_0.c[(uint)(int)cVar1],true);
            uVar11 = uVar11 + 1;
          } while (uVar11 != 0x10);
        }
        else if (eVar4 == cColorDXT1) {
          local_a4 = p->m_dxt1a_alpha_threshold;
          if (this->m_format == cDXT1A) {
            local_9c = true;
            if (local_a4 <= (local_70->field_0).field_0.a) {
              uVar11 = 0;
              do {
                uVar15 = uVar11;
                if (uVar15 == 0xf) break;
                uVar11 = uVar15 + 1;
              } while (local_a4 <= local_70[uVar15 + 1].field_0.field_0.a);
              local_9c = uVar15 < 0xf;
            }
          }
          else {
            local_9c = false;
          }
          local_50.m_pSelectors = local_68;
          local_96 = false;
          local_b8 = (undefined1  [4])(this->m_blocks_x * block_y + block_x);
          local_a0 = p->m_quality;
          local_9a = p->m_perceptual;
          local_99 = p->m_grayscale_sampling;
          local_9b = p->m_use_both_block_types;
          local_97 = p->m_use_transparent_indices_for_black;
          local_b0 = local_70;
          local_a8 = 0x10;
          local_98 = p->m_endpoint_caching;
          if (1 < (uint)this->m_format) {
            local_9b = false;
          }
          bVar8 = dxt1_endpoint_optimizer::compute
                            (&context->m_dxt1_optimizer,(params *)local_b8,&local_50);
          if (bVar8) {
            *(uint16 *)&dst_block->field_0 = local_50.m_low_color;
            *(uint16 *)((long)&dst_block->field_0 + 2) = local_50.m_high_color;
            bVar10 = 0;
            uVar11 = 0;
            do {
              uVar15 = uVar11 >> 2 & 0x3fffffff;
              dst_block->m_low_color[uVar15 - 4] =
                   local_68[uVar11] << (bVar10 & 6) |
                   ~(byte)(3 << (bVar10 & 6)) & dst_block->m_low_color[uVar15 - 4];
              uVar11 = uVar11 + 1;
              bVar10 = bVar10 + 2;
            } while (uVar11 != 0x10);
          }
        }
        uVar16 = uVar16 + 1;
        dst_block = (etc1_block *)dst_block->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
  }
  return;
}

Assistant:

void dxt_image::set_block_pixels(
        uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p,
        set_block_pixels_context& context)
    {
        element* pElement = &get_element(block_x, block_y, 0);

        if (m_format == cETC1)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);

#if CRNLIB_USE_RG_ETC1
            rg_etc1::etc1_quality etc_quality = rg_etc1::cHighQuality;
            if (p.m_quality <= cCRNDXTQualityFast)
            {
                etc_quality = rg_etc1::cLowQuality;
            }
            else if (p.m_quality <= cCRNDXTQualityNormal)
            {
                etc_quality = rg_etc1::cMediumQuality;
            }

            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            //pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
#else
            crn_etc_quality etc_quality = cCRNETCQualitySlow;
            if (p.m_quality <= cCRNDXTQualityFast)
                etc_quality = cCRNETCQualityFast;
            else if (p.m_quality <= cCRNDXTQualityNormal)
                etc_quality = cCRNETCQualityMedium;

            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            pack_params.m_dithering = p.m_dithering;

            pack_etc1_block(dst_block, pPixels, pack_params, context.m_etc1_optimizer);
#endif
        }
        else if (m_format == cETC2)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);
            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                   : rg_etc1::cHighQuality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
        }
        else if (m_format == cETC2A)
        {
            rg_etc1::etc1_quality etc_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                               : rg_etc1::cHighQuality;
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = etc_quality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    rg_etc1::etc1_pack_params pack_params;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = etc_quality;
                    rg_etc1::pack_etc1_block(pElement, (uint32*)pPixels, pack_params);
                }
            }
        }
        else if (m_format == cETC1S)
        {
            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                 : cCRNETCQualitySlow;
            pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
        }
        else if (m_format == cETC2AS)
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                           : rg_etc1::cHighQuality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    crn_etc1_pack_params pack_params;
                    pack_params.m_perceptual = p.m_perceptual;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                         : cCRNETCQualitySlow;
                    pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
                }
            }
        }
        else
#if CRNLIB_SUPPORT_SQUISH
            if ((p.m_compressor == cCRNDXTCompressorSquish) && ((m_format == cDXT1) || (m_format == cDXT1A) || (m_format == cDXT3) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            uint squish_flags = 0;
            if ((m_format == cDXT1) || (m_format == cDXT1A))
                squish_flags = squish::kDxt1;
            else if (m_format == cDXT3)
                squish_flags = squish::kDxt3;
            else if (m_format == cDXT5A)
                squish_flags = squish::kDxt5A;
            else
                squish_flags = squish::kDxt5;

            if (p.m_perceptual)
                squish_flags |= squish::kColourMetricPerceptual;
            else
                squish_flags |= squish::kColourMetricUniform;

            if (p.m_quality >= cCRNDXTQualityBetter)
                squish_flags |= squish::kColourIterativeClusterFit;
            else if (p.m_quality == cCRNDXTQualitySuperFast)
                squish_flags |= squish::kColourRangeFit;

            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            memcpy(pixels, pPixels, sizeof(color_quad_u8) * cDXTBlockSize * cDXTBlockSize);

            if (m_format == cDXT1)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    pixels[i].a = 255;
            }
            else if (m_format == cDXT1A)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    if (pixels[i].a < p.m_dxt1a_alpha_threshold)
                        pixels[i].a = 0;
                    else
                        pixels[i].a = 255;
            }

            squish::Compress(reinterpret_cast<const squish::u8*>(pixels), pElement, squish_flags);
        }

        else
#endif // CRNLIB_SUPPORT_SQUISH \
    // RYG doesn't support DXT1A
            if ((p.m_compressor == cCRNDXTCompressorRYG) && ((m_format == cDXT1) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
            {
                pixels[i].r = pPixels[i].b;
                pixels[i].g = pPixels[i].g;
                pixels[i].b = pPixels[i].r;

                if (m_format != cDXT1)
                {
                    pixels[i].a = pPixels[i].a;
                }
                else
                {
                    pixels[i].a = 255;
                }
            }

            if (m_format == cDXT5A)
            {
                ryg_dxt::sCompressDXT5ABlock((sU8*)pElement, (const sU32*)pixels);
            }
            else
            {
                ryg_dxt::sCompressDXTBlock((sU8*)pElement, (const sU32*)pixels, m_format == cDXT5, 0);
            }
        }
        else if ((p.m_compressor == cCRNDXTCompressorCRNF) && (m_format != cDXT1A))
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);
                    dxt_fast::compress_color_block(pDXT1_block, pPixels, p.m_quality >= cCRNDXTQualityNormal);

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);
                    dxt_fast::compress_alpha_block(pDXT5_block, pPixels, m_element_component_index[element_index]);

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
        else
        {
            dxt1_endpoint_optimizer& dxt1_optimizer = context.m_dxt1_optimizer;
            dxt5_endpoint_optimizer& dxt5_optimizer = context.m_dxt5_optimizer;

            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                    bool pixels_have_alpha = false;
                    if (m_format == cDXT1A)
                    {
                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            if (pPixels[i].a < p.m_dxt1a_alpha_threshold)
                            {
                                pixels_have_alpha = true;
                                break;
                            }
                        }
                    }

                    dxt1_endpoint_optimizer::results results;
                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt1_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_quality = p.m_quality;
                    params.m_perceptual = p.m_perceptual;
                    params.m_grayscale_sampling = p.m_grayscale_sampling;
                    params.m_pixels_have_alpha = pixels_have_alpha;
                    params.m_use_alpha_blocks = p.m_use_both_block_types;
                    params.m_use_transparent_indices_for_black = p.m_use_transparent_indices_for_black;
                    params.m_dxt1a_alpha_threshold = p.m_dxt1a_alpha_threshold;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_endpoint_caching = p.m_endpoint_caching;

                    if ((m_format != cDXT1) && (m_format != cDXT1A))
                    {
                        params.m_use_alpha_blocks = false;
                    }

                    if (!dxt1_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT1_block->set_low_color(results.m_low_color);
                    pDXT1_block->set_high_color(results.m_high_color);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT1_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                    dxt5_endpoint_optimizer::results results;

                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt5_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_comp_index = m_element_component_index[element_index];
                    params.m_quality = p.m_quality;
                    params.m_use_both_block_types = p.m_use_both_block_types;

                    if (!dxt5_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT5_block->set_low_alpha(results.m_first_endpoint);
                    pDXT5_block->set_high_alpha(results.m_second_endpoint);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT5_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
    }